

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::Id<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Id(Id<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  IdBlockBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Id<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_10;
  Id<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  local_10 = this;
  IdBlockBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IdBlockBase(&local_40);
  std::
  variant<matchit::impl::IdBlock<std::__cxx11::string>,matchit::impl::IdBlock<std::__cxx11::string>*>
  ::
  variant<matchit::impl::IdBlock<std::__cxx11::string>,void,void,matchit::impl::IdBlock<std::__cxx11::string>,void>
            ((variant<matchit::impl::IdBlock<std::__cxx11::string>,matchit::impl::IdBlock<std::__cxx11::string>*>
              *)this,(IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40);
  IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IdBlock((IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_40);
  return;
}

Assistant:

constexpr Id() = default;